

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

FundUtxoJsonData * __thiscall
cfd::js::api::json::FundUtxoJsonData::GetScriptSigTemplateString_abi_cxx11_
          (FundUtxoJsonData *this,FundUtxoJsonData *obj)

{
  FundUtxoJsonData *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->script_sig_template_);
  return this;
}

Assistant:

static std::string GetScriptSigTemplateString(  // line separate
      const FundUtxoJsonData& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.script_sig_template_);
  }